

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffplsw(fitsfile *fptr,int *status)

{
  int iVar1;
  int tstatus;
  char valstring [71];
  char comm [73];
  int local_bc;
  char local_b8 [80];
  char local_68 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_bc = 0;
  iVar1 = ffgkys(fptr,"LONGSTRN",local_b8,local_68,&local_bc);
  if (iVar1 != 0) {
    ffpkys(fptr,"LONGSTRN","OGIP 1.0","The HEASARC Long String Convention may be used.",status);
    ffpcom(fptr,"  This FITS file may contain long string keyword values that are",status);
    ffpcom(fptr,"  continued over multiple keywords.  The HEASARC convention uses the &",status);
    ffpcom(fptr,"  character at the end of each substring which is then continued",status);
    ffpcom(fptr,"  on the next keyword which has the name CONTINUE.",status);
  }
  return *status;
}

Assistant:

int ffplsw( fitsfile *fptr,     /* I - FITS file pointer  */
            int  *status)       /* IO - error status       */
/*
  Write the LONGSTRN keyword and a series of related COMMENT keywords
  which document that this FITS header may contain long string keyword
  values which are continued over multiple keywords using the HEASARC
  long string keyword convention.  If the LONGSTRN keyword already exists
  then this routine simple returns without doing anything.
*/
{
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT];
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = 0;
    if (ffgkys(fptr, "LONGSTRN", valstring, comm, &tstatus) == 0)
        return(*status);     /* keyword already exists, so just return */

    ffpkys(fptr, "LONGSTRN", "OGIP 1.0", 
       "The HEASARC Long String Convention may be used.", status);

    ffpcom(fptr,
    "  This FITS file may contain long string keyword values that are", status);

    ffpcom(fptr,
    "  continued over multiple keywords.  The HEASARC convention uses the &",
    status);

    ffpcom(fptr,
    "  character at the end of each substring which is then continued", status);

    ffpcom(fptr,
    "  on the next keyword which has the name CONTINUE.", status);

    return(*status);
}